

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O3

void different_stl_string_pointer_and_reference_are_not_equal(void)

{
  string *psVar1;
  Constraint_ *pCVar2;
  string alice;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"bob","");
  bob_pointer_abi_cxx11_ = psVar1;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"alice","");
  psVar1 = bob_pointer_abi_cxx11_;
  pCVar2 = (Constraint_ *)cgreen::create_not_equal_to_string_constraint((string *)local_30,"alice");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x84,"bob_pointer",(string *)psVar1,pCVar2);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

Ensure(different_stl_string_pointer_and_reference_are_not_equal) {
    bob_pointer = new std::string("bob");
    std::string alice("alice");

    assert_that(bob_pointer, is_not_equal_to_string(alice));
}